

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  MppCodingType MVar1;
  MpiEncTestArgs *pMVar2;
  MppPacket *ppvVar3;
  MppApi *pMVar4;
  MppCtx pvVar5;
  MppEncCfg pvVar6;
  MppParam pvVar7;
  MpiEncTestArgs *pMVar8;
  MppApi **ppMVar9;
  MPP_RET MVar10;
  int iVar11;
  RK_S32 RVar12;
  undefined4 uVar13;
  MpiEncTestArgs *cmd;
  MpiRc2TestCtx *ctx;
  size_t sVar14;
  FILE *pFVar15;
  RK_S64 RVar16;
  void *__ptr;
  RK_U8 *pRVar17;
  undefined8 uVar18;
  long lVar19;
  ulong uVar20;
  RK_U32 RVar21;
  char *pcVar22;
  int iVar23;
  MppBufferGroup *ppvVar24;
  RK_U32 RVar25;
  uint uVar26;
  MppCtx *ppvVar27;
  char *pcVar28;
  double dVar29;
  undefined8 uStackY_c0;
  MppPollType block;
  undefined4 uStack_9c;
  MppBufferGroup *local_98;
  MppCtx *local_90;
  MpiEncTestArgs *local_88;
  MppPollType block_1;
  undefined4 uStack_7c;
  MppFrameFormat format;
  RK_U32 fast_en;
  MppApi *local_70;
  MppPacket *local_68;
  MppApi **local_60;
  MppCtx *local_58;
  MppApi **local_50;
  MppApi **local_48;
  MppCtx *local_40;
  int local_34;
  
  cmd = mpi_enc_test_cmd_get();
  MVar10 = mpi_enc_test_cmd_update_by_args(cmd,argc,argv);
  if (MVar10 != MPP_OK) goto LAB_00106ecb;
  mpi_enc_test_cmd_show_opt(cmd);
  ctx = (MpiRc2TestCtx *)mpp_osal_calloc("main",0x2a0);
  if (ctx == (MpiRc2TestCtx *)0x0) {
    MVar10 = MPP_ERR_MALLOC;
    goto LAB_00106ecb;
  }
  ctx->enc_cmd = cmd;
  if (cmd->file_input == (char *)0x0) {
    pcVar22 = (char *)0x0;
  }
  else {
    reader_init(&ctx->reader,cmd->file_input,cmd->type_src);
    pcVar22 = cmd->file_input;
  }
  if (ctx->reader == (FileReader)0x0) {
    _mpp_log_l(2,"mpi_rc_test","failed to open dec input file %s\n",0,pcVar22);
    MVar10 = MPP_NOK;
LAB_00106ad4:
    _mpp_log_l(2,"mpi_rc_test","mpi_rc_init failded ret %d",0,MVar10);
  }
  else {
    sVar14 = reader_size(ctx->reader);
    _mpp_log_l(4,"mpi_rc_test","input file %s size %ld\n",0,pcVar22,sVar14);
    ctx->dec_type = cmd->type_src;
    if (cmd->file_output != (char *)0x0) {
      pFVar15 = fopen(cmd->file_output,"w+b");
      (ctx->file).fp_enc_out = (FILE *)pFVar15;
      if (pFVar15 == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_rc_test","failed to open enc output file %s\n",0,cmd->file_output);
        MVar10 = MPP_ERR_OPEN_FILE;
        goto LAB_00106ad4;
      }
    }
    ppvVar24 = &ctx->pkt_grp;
    iVar11 = mpp_buffer_group_get(ppvVar24,1,0,"mpi_rc_test","mpi_rc_buffer_init");
    if (iVar11 == 0) {
      pRVar17 = (RK_U8 *)mpp_osal_calloc("mpi_rc_buffer_init",0x40000);
      ctx->dec_in_buf_post = pRVar17;
      if (pRVar17 == (RK_U8 *)0x0) {
        _mpp_log_l(2,"mpi_rc_test","mpi_dec_test malloc input stream buffer failed\n",0);
        goto LAB_00106997;
      }
      ctx->dec_in_buf_post_size = 0x40000;
      ctx->frm_idx = 0;
      ctx->calc_base_idx = 0;
      ctx->stream_size_1s = 0;
LAB_00106a60:
      pMVar2 = ctx->enc_cmd;
      _block = (MppParam)((ulong)_block & 0xffffffff00000000);
      _block_1 = (MppParam)((ulong)_block_1 & 0xffffffff00000000);
      local_40 = &ctx->dec_ctx_post;
      local_48 = &ctx->dec_mpi_post;
      local_98 = ppvVar24;
      MVar10 = mpp_create();
      if (MVar10 == MPP_OK) {
        pvVar5 = ctx->dec_ctx_post;
        pMVar4 = ctx->dec_mpi_post;
        MVar10 = mpp_packet_init(&ctx->dec_pkt_post,ctx->dec_in_buf_post,ctx->dec_in_buf_post_size);
        if (MVar10 != MPP_OK) {
          pcVar22 = "mpp_packet_init failed\n";
LAB_00106bce:
          _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
          goto LAB_00106bdf;
        }
        MVar10 = (*pMVar4->control)(pvVar5,MPP_DEC_SET_PARSER_SPLIT_MODE,&block_1);
        if (MVar10 != MPP_OK) {
          pcVar22 = "dec_mpi->control failed\n";
          goto LAB_00106bce;
        }
        MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_INPUT_TIMEOUT,&block);
        if (MVar10 != MPP_OK) {
          pcVar22 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
          goto LAB_00106bce;
        }
        _block = (MppParam)((ulong)_block & 0xffffffff00000000);
        MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_OUTPUT_TIMEOUT,&block);
        if (MVar10 != MPP_OK) {
          pcVar22 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
          goto LAB_00106bce;
        }
        MVar10 = mpp_init(pvVar5,0,pMVar2->type);
        if (MVar10 != MPP_OK) {
          pcVar22 = "mpp_init dec failed\n";
          goto LAB_00106aa2;
        }
LAB_00106be7:
        _block_1 = (MppParam)((ulong)_block_1 & 0xffffffff00000000);
        fast_en = 0;
        _block = (MppParam)CONCAT44(uStack_9c,1);
        format = MPP_FMT_YUV420SP;
        local_34 = 0;
        mpp_env_get_u32("fbc_dec_en",&local_34,0);
        mpp_env_get_u32("fast_en",&fast_en,0);
        if (local_34 != 0) {
          format = 0x200000;
        }
        local_58 = &ctx->dec_ctx_pre;
        local_60 = &ctx->dec_mpi_pre;
        MVar10 = mpp_create();
        if (MVar10 == MPP_OK) {
          pvVar5 = ctx->dec_ctx_pre;
          pMVar4 = ctx->dec_mpi_pre;
          MVar10 = mpp_packet_init(&ctx->dec_pkt_pre,ctx->dec_in_buf_pre,ctx->dec_in_buf_pre_size);
          if (MVar10 != MPP_OK) {
            pcVar22 = "mpp_packet_init failed\n";
            goto LAB_00106cd7;
          }
          MVar10 = (*pMVar4->control)(pvVar5,MPP_DEC_SET_PARSER_SPLIT_MODE,&block);
          pcVar22 = "dec_mpi->control failed\n";
          if ((MVar10 != MPP_OK) ||
             (MVar10 = (*pMVar4->control)(pvVar5,MPP_DEC_SET_PARSER_FAST_MODE,&fast_en),
             MVar10 != MPP_OK)) goto LAB_00106cd7;
          MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_INPUT_TIMEOUT,&block_1);
          if (MVar10 != MPP_OK) {
            pcVar22 = "dec_mpi->control dec MPP_SET_INPUT_TIMEOUT failed\n";
            goto LAB_00106cd7;
          }
          _block_1 = (MppParam)((ulong)_block_1 & 0xffffffff00000000);
          MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_OUTPUT_TIMEOUT,&block_1);
          if (MVar10 != MPP_OK) {
            pcVar22 = "dec_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
            goto LAB_00106cd7;
          }
          MVar10 = mpp_init(pvVar5,0,ctx->dec_type);
          if (MVar10 != MPP_OK) {
            pcVar22 = "mpp_init dec failed\n";
            goto LAB_00106cd7;
          }
          MVar10 = (*pMVar4->control)(pvVar5,MPP_DEC_SET_OUTPUT_FORMAT,&format);
          if (MVar10 != MPP_OK) goto LAB_00106cd7;
        }
        else {
          pcVar22 = "mpp_create decoder failed\n";
LAB_00106cd7:
          _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
          if (MVar10 < MPP_OK) goto LAB_00106d51;
        }
        iVar11 = mpp_enc_cfg_init(&ctx->cfg);
        if (-1 < iVar11) {
          pMVar2 = ctx->enc_cmd;
          _block_1 = (MppParam)CONCAT44(uStack_7c,1);
          ppvVar3 = (MppPacket *)ctx->cfg;
          fast_en = 0;
          format = MPP_FMT_YUV420SP;
          local_90 = &ctx->enc_ctx;
          local_50 = &ctx->enc_mpi;
          MVar10 = mpp_create();
          if (MVar10 == MPP_OK) {
            pvVar5 = ctx->enc_ctx;
            pMVar4 = ctx->enc_mpi;
            (ctx->rc_cfg).fps_out_num = 0x1e;
            (ctx->rc_cfg).fps_out_denom = 1;
            (ctx->rc_cfg).fps_in_flex = 0;
            (ctx->rc_cfg).fps_in_num = 0x1e;
            (ctx->rc_cfg).fps_in_denom = 1;
            (ctx->rc_cfg).fps_out_flex = 0;
            (ctx->rc_cfg).max_reenc_times = 1;
            (ctx->rc_cfg).gop = pMVar2->gop_len;
            _block = (MppParam)CONCAT44(uStack_9c,0xffffffff);
            local_68 = ppvVar3;
            MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_INPUT_TIMEOUT,&block);
            if (MVar10 != MPP_OK) {
              pcVar22 = "enc_mpi->control MPP_SET_INPUT_TIMEOUT failed\n";
              goto LAB_00106fb4;
            }
            _block = (MppParam)CONCAT44(uStack_9c,0xffffffff);
            local_88 = pMVar2;
            MVar10 = (*pMVar4->control)(pvVar5,MPP_SET_OUTPUT_TIMEOUT,&block);
            pMVar2 = local_88;
            if (MVar10 != MPP_OK) {
              pcVar22 = "enc_mpi->control MPP_SET_OUTPUT_TIMEOUT failed\n";
              goto LAB_00106fb4;
            }
            local_70 = pMVar4;
            MVar10 = mpp_init(pvVar5,1,local_88->type);
            ppvVar3 = local_68;
            if (MVar10 != MPP_OK) {
              pcVar22 = "mpp_init enc failed\n";
              goto LAB_00106fb4;
            }
            if (pMVar2->width != 0) {
              mpp_enc_cfg_set_s32(local_68,"prep:width");
            }
            if (local_88->height != 0) {
              mpp_enc_cfg_set_s32(ppvVar3,"prep:height");
            }
            if (local_88->hor_stride != 0) {
              mpp_enc_cfg_set_s32(ppvVar3,"prep:hor_stride");
            }
            if (local_88->ver_stride != 0) {
              mpp_enc_cfg_set_s32(ppvVar3,"prep:ver_stride");
            }
            mpp_enc_cfg_set_s32(ppvVar3,"prep:format",0);
            pMVar2 = local_88;
            mpp_enc_cfg_set_s32(ppvVar3,"rc:mode",local_88->rc_mode);
            pMVar8 = local_88;
            iVar11 = pMVar2->rc_mode;
            if (iVar11 == 0) {
              iVar23 = 0x10;
              mpp_enc_cfg_set_s32(ppvVar3,"rc:bps_target",local_88->bps_target);
              iVar11 = pMVar8->bps_max;
              if (iVar11 == 0) {
                iVar11 = pMVar8->bps_target * 0x11;
LAB_001077fd:
                iVar11 = iVar11 / iVar23;
              }
LAB_00107802:
              mpp_enc_cfg_set_s32(ppvVar3,"rc:bps_max",iVar11);
              if (pMVar8->bps_min == 0) {
                uVar20 = (long)pMVar8->bps_target / (long)iVar23 & 0xffffffff;
              }
              else {
                uVar20 = (ulong)(uint)pMVar8->bps_max;
              }
              mpp_enc_cfg_set_s32(ppvVar3,"rc:bps_min",uVar20);
            }
            else if (iVar11 != 2) {
              if (iVar11 == 1) {
                iVar23 = 2;
                mpp_enc_cfg_set_s32(ppvVar3,"rc:bps_target",local_88->bps_target);
                iVar11 = pMVar8->bps_max;
                if (iVar11 == 0) {
                  iVar11 = pMVar8->bps_target * 3;
                  goto LAB_001077fd;
                }
                goto LAB_00107802;
              }
              _mpp_log_l(2,"mpi_rc_test","unsupport encoder rc mode %d\n","mpi_rc_enc_init");
            }
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_in_flex",(ctx->rc_cfg).fps_in_flex);
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_in_num",(ctx->rc_cfg).fps_in_num);
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_in_denom",(ctx->rc_cfg).fps_in_denom);
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_out_flex",(ctx->rc_cfg).fps_out_flex);
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_out_num",(ctx->rc_cfg).fps_out_num);
            mpp_enc_cfg_set_s32(ppvVar3,"rc:fps_out_denom",(ctx->rc_cfg).fps_out_denom);
            pMVar2 = local_88;
            iVar11 = 0x3c;
            if (local_88->gop_len != 0) {
              iVar11 = local_88->gop_len;
            }
            mpp_enc_cfg_set_s32(ppvVar3,"rc:gop",iVar11);
            mpp_enc_cfg_set_u32(ppvVar3,"rc:drop_mode",0);
            mpp_enc_cfg_set_u32(ppvVar3,"rc:drop_thd",0x14);
            mpp_enc_cfg_set_u32(ppvVar3,"rc:drop_gap",1);
            mpp_env_get_u32("dbrh_en",&fast_en,0);
            mpp_env_get_u32("dbrh_s",&format,0x10);
            mpp_enc_cfg_set_u32(ppvVar3,"rc:debreath_en",fast_en);
            mpp_enc_cfg_set_u32(ppvVar3,"rc:debreath_strength",format);
            mpp_enc_cfg_set_s32(ppvVar3,"codec:type",pMVar2->type);
            MVar1 = pMVar2->type;
            if (MVar1 == MPP_VIDEO_CodingHEVC) {
              mpp_enc_cfg_set_s32(ppvVar3,"h265:qp_init",-(uint)(local_88->rc_mode == 2) | 0x1a);
              mpp_enc_cfg_set_s32(ppvVar3,"h265:qp_max",0x33);
              mpp_enc_cfg_set_s32(ppvVar3,"h265:qp_min",10);
              mpp_enc_cfg_set_s32(ppvVar3,"h265:qp_max_i",0x2e);
              pcVar22 = "h265:qp_min_i";
LAB_00107c12:
              uStackY_c0 = 0x12;
LAB_00107c18:
              mpp_enc_cfg_set_s32(ppvVar3,pcVar22,uStackY_c0);
            }
            else {
              if (MVar1 == MPP_VIDEO_CodingMJPEG) {
                mpp_enc_cfg_set_s32(ppvVar3,"jpeg:q_factor",0x50);
                mpp_enc_cfg_set_s32(ppvVar3,"jpeg:qf_max",99);
                pcVar22 = "jpeg:qf_min";
                uStackY_c0 = 1;
                goto LAB_00107c18;
              }
              if (MVar1 == MPP_VIDEO_CodingVP8) {
                mpp_enc_cfg_set_s32(ppvVar3,"vp8:qp_init",0x28);
                mpp_enc_cfg_set_s32(ppvVar3,"vp8:qp_max",0x7f);
                mpp_enc_cfg_set_s32(ppvVar3,"vp8:qp_min",0);
                mpp_enc_cfg_set_s32(ppvVar3,"vp8:qp_max_i",0x7f);
                pcVar22 = "vp8:qp_min_i";
                uStackY_c0 = 0;
                goto LAB_00107c18;
              }
              if (MVar1 == MPP_VIDEO_CodingAVC) {
                mpp_enc_cfg_set_s32(ppvVar3,"h264:profile",100);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:level",0x28);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:cabac_en",1);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:cabac_idc",0);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:trans8x8",1);
                if (local_88->rc_mode != 2) {
                  mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_init",0x1a);
                  mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_max",0x33);
                  mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_min",10);
                  mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_max_i",0x2e);
                  pcVar22 = "h264:qp_min_i";
                  goto LAB_00107c12;
                }
                mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_init",0x14);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_max",0x10);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_min",0x10);
                mpp_enc_cfg_set_s32(ppvVar3,"h264:qp_max_i",0x14);
                pcVar22 = "h264:qp_min_i";
                uStackY_c0 = 0x14;
                goto LAB_00107c18;
              }
              _mpp_log_l(2,"mpi_rc_test","unsupport encoder coding type %d\n","mpi_rc_enc_init");
            }
            pMVar4 = local_70;
            ppvVar27 = local_90;
            ppvVar24 = local_98;
            MVar10 = (*local_70->control)(pvVar5,MPP_ENC_SET_CFG,ppvVar3);
            if (MVar10 != MPP_OK) {
              pcVar22 = "mpi control enc set cfg failed ret %d\n";
LAB_00107c7d:
              _mpp_log_l(2,"mpi_rc_test",pcVar22,0,MVar10);
              goto LAB_00106fca;
            }
            MVar10 = (*pMVar4->control)(pvVar5,MPP_ENC_SET_SEI_CFG,&block_1);
            if (MVar10 != MPP_OK) {
              pcVar22 = "mpi control enc set sei cfg failed ret %d\n";
              goto LAB_00107c7d;
            }
          }
          else {
            pcVar22 = "mpp_create encoder failed\n";
LAB_00106fb4:
            _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
            ppvVar24 = local_98;
            ppvVar27 = local_90;
LAB_00106fca:
            if (MVar10 < MPP_OK) goto LAB_001069dc;
          }
          pthread_create(&ctx->dec_thr,(pthread_attr_t *)0x0,rc2_pre_dec_thread,ctx);
          local_68 = &ctx->enc_pkt;
          do {
            pMVar4 = *local_60;
            pvVar5 = *local_58;
            _block = (MppParam)0x0;
            while (MVar10 = (*pMVar4->decode_get_frame)(pvVar5,(MppFrame *)&block), MVar10 == MPP_OK
                  ) {
              if (_block == (MppParam)0x0) {
                usleep(3000);
              }
              else {
                RVar12 = mpp_frame_get_eos();
                ctx->frm_eos = RVar12;
                iVar11 = mpp_frame_get_info_change(_block);
                if (iVar11 == 0) {
                  iVar11 = ctx->enc_cmd->frame_num;
                  if ((0 < iVar11) && (iVar11 < ctx->frm_idx)) {
                    ctx->loop_end = 1;
                    mpp_frame_set_eos(_block,1);
                    RVar12 = mpp_frame_get_eos(_block);
                    ctx->frm_eos = RVar12;
                  }
                  ppMVar9 = local_50;
                  (*(*local_50)->encode_put_frame)(*ppvVar27,_block);
                  ppvVar3 = local_68;
                  (*(*ppMVar9)->encode_get_packet)(*ppvVar27,local_68);
                  if (*ppvVar3 != (MppPacket)0x0) {
                    uVar20 = mpp_packet_get_length();
                    RVar25 = (RK_U32)uVar20;
                    (ctx->stat).frame_size = RVar25;
                    RVar21 = ctx->stream_size_1s + RVar25;
                    ctx->stream_size_1s = RVar21;
                    ctx->total_bits = ctx->total_bits + uVar20 * 8;
                    if (((ctx->frm_idx - ctx->calc_base_idx) + 1) % (uint)(ctx->rc_cfg).fps_in_num
                        == 0) {
                      (ctx->stat).ins_bitrate = RVar21;
                      ctx->stream_size_1s = 0;
                    }
                    __ptr = (void *)mpp_packet_get_pos(ctx->enc_pkt);
                    pFVar15 = (FILE *)(ctx->file).fp_enc_out;
                    if (pFVar15 != (FILE *)0x0) {
                      fwrite(__ptr,1,uVar20,pFVar15);
                    }
                    if (ctx->dec_in_buf_post_size < uVar20) {
                      uVar26 = RVar25 + 0xfff & 0xfffff000;
                      pRVar17 = (RK_U8 *)mpp_osal_realloc("mpi_rc_enc",ctx->dec_in_buf_post,uVar26);
                      ctx->dec_in_buf_post = pRVar17;
                      ctx->dec_in_buf_post_size = uVar26;
                      mpp_packet_set_data(ctx->dec_pkt_post,pRVar17);
                      ppvVar27 = local_90;
                      mpp_packet_set_size(ctx->dec_pkt_post,uVar26);
                      mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                      mpp_packet_set_length(ctx->dec_pkt_post,0);
                    }
                    mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                    mpp_packet_set_pos(ctx->dec_pkt_post,ctx->dec_in_buf_post);
                    mpp_packet_set_length(ctx->dec_pkt_post,uVar20);
                    mpp_packet_set_size(ctx->dec_pkt_post,uVar20);
                    iVar11 = mpp_packet_has_meta(ctx->enc_pkt);
                    if (iVar11 == 0) {
                      if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                        mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                        mpi_rc_dec_post_decode(ctx,_block);
                      }
                    }
                    else {
                      _block_1 = (MppParam)0x0;
                      uVar18 = mpp_packet_get_meta(ctx->enc_pkt);
                      mpp_meta_get_frame(uVar18,0x6966726d,&block_1);
                      if ((ctx->enc_cmd->ssim_en != 0) || (ctx->enc_cmd->psnr_en != 0)) {
                        mpp_packet_write(ctx->dec_pkt_post,0,__ptr);
                        mpi_rc_dec_post_decode(ctx,_block_1);
                      }
                      if (_block_1 != (MppParam)0x0) {
                        _block = _block_1;
                      }
                    }
                    RVar21 = mpp_packet_get_eos(ctx->enc_pkt);
                    ctx->enc_pkt_eos = RVar21;
                    ctx->frm_idx = ctx->frm_idx + 1;
                    mpp_packet_deinit(local_68);
                  }
                }
                else {
                  _mpp_log_l(4,"mpi_rc_test","decode_get_frame get info changed found\n",0);
                  (*pMVar4->control)(pvVar5,MPP_DEC_SET_INFO_CHANGE_READY,(MppParam)0x0);
                  pvVar7 = _block;
                  pvVar6 = ctx->cfg;
                  uVar13 = mpp_frame_get_width(_block);
                  mpp_enc_cfg_set_s32(pvVar6,"prep:width",uVar13);
                  pvVar6 = ctx->cfg;
                  uVar13 = mpp_frame_get_height(pvVar7);
                  mpp_enc_cfg_set_s32(pvVar6,"prep:height",uVar13);
                  pvVar6 = ctx->cfg;
                  uVar13 = mpp_frame_get_hor_stride(pvVar7);
                  mpp_enc_cfg_set_s32(pvVar6,"prep:hor_stride",uVar13);
                  pvVar6 = ctx->cfg;
                  uVar13 = mpp_frame_get_ver_stride(pvVar7);
                  mpp_enc_cfg_set_s32(pvVar6,"prep:ver_stride",uVar13);
                  pvVar6 = ctx->cfg;
                  uVar13 = mpp_frame_get_fmt(pvVar7);
                  mpp_enc_cfg_set_s32(pvVar6,"prep:format",uVar13);
                  (*ctx->enc_mpi->control)(ctx->enc_ctx,MPP_ENC_SET_CFG,ctx->cfg);
                  (*ctx->dec_mpi_post->control)(ctx->dec_ctx_post,MPP_DEC_SET_FRAME_INFO,pvVar7);
                  RVar16 = mpp_time();
                  ctx->start_enc = RVar16;
                }
                mpp_frame_deinit(&block);
                _block = (MppParam)0x0;
                if (ctx->enc_pkt_eos != 0) goto LAB_0010743e;
              }
            }
            _mpp_log_l(2,"mpi_rc_test","decode_get_frame failed ret %d\n",0,MVar10);
          } while (ctx->enc_pkt_eos == 0);
LAB_0010743e:
          _mpp_log_l(4,"mpi_rc_test","stream finish\n",0);
          lVar19 = mpp_time();
          uVar20 = lVar19 - ctx->start_enc;
          _mpp_log_l(SUB84((double)(((float)ctx->frm_idx * 1e+06) / (float)uVar20),0),4,
                     "mpi_rc_test","enc_dec %d frame use time %lld ms frm rate %.2f\n",0,
                     ctx->frm_idx,uVar20 / 1000);
          iVar11 = ctx->frm_idx;
          if ((long)iVar11 != 0) {
            pMVar2 = ctx->enc_cmd;
            pcVar28 = "smart_p";
            pcVar22 = "smart_p";
            if (pMVar2->gop_mode == 0) {
              pcVar22 = "normal_p";
            }
            _mpp_log_l(SUB84(ctx->total_psnrs * (1.0 / (double)iVar11),0),
                       (1.0 / (double)iVar11) * ctx->total_ssims,4,"mpi_rc_test",
                       "%s: %s: average: bps %d | psnr %5.2f | ssim %5.5f",0,pMVar2->file_input,
                       pcVar22,(int)(ctx->total_bits / (ulong)(long)iVar11) * 0x1e);
            pFVar15 = (FILE *)(ctx->file).fp_stat;
            if (pFVar15 != (FILE *)0x0) {
              if (pMVar2->gop_mode == 0) {
                pcVar28 = "normal_p";
              }
              dVar29 = 1.0 / (double)ctx->frm_idx;
              fprintf(pFVar15,"%s: %s: average: bps %dk | psnr %5.2f | ssim %5.5f \n",
                      SUB84(ctx->total_psnrs * dVar29,0),dVar29 * ctx->total_ssims,
                      pMVar2->file_input,pcVar28,
                      (ulong)(uint)((int)(ctx->total_bits / (ulong)(long)ctx->frm_idx) * 0x1e) /
                      1000);
            }
          }
          MVar10 = (*(*local_50)->reset)(*local_90);
          if (MVar10 < MPP_OK) {
            _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
            ppvVar24 = local_98;
          }
          else {
            MVar10 = (*(*local_60)->reset)(*local_58);
            ppvVar24 = local_98;
            if ((MVar10 < MPP_OK) || (MVar10 = (*(*local_48)->reset)(*local_40), MVar10 < MPP_OK))
            goto LAB_001069dc;
          }
          goto LAB_00106d75;
        }
      }
      else {
        pcVar22 = "mpp_create decoder failed\n";
LAB_00106aa2:
        _mpp_log_l(2,"mpi_rc_test",pcVar22,0);
LAB_00106bdf:
        if (MPP_NOK < MVar10) goto LAB_00106be7;
      }
LAB_00106d51:
      _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
      ppvVar24 = local_98;
    }
    else {
      _mpp_log_l(2,"mpi_rc_test","failed to get buffer group for output packet ret %d\n",0,iVar11);
LAB_00106997:
      ctx->dec_ctx_post = (MppCtx)0x0;
      ctx->dec_ctx_pre = (MppCtx)0x0;
      if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
        mpp_osal_free("mpi_rc_buffer_init");
      }
      ctx->dec_in_buf_post = (RK_U8 *)0x0;
      if (ctx->pkt_grp != (MppBufferGroup)0x0) {
        mpp_buffer_group_put();
        *ppvVar24 = (MppBufferGroup)0x0;
      }
      if (-1 < iVar11) goto LAB_00106a60;
LAB_001069dc:
      _mpp_log_l(2,"mpi_rc_test","%d failed\n","mpi_rc_codec");
    }
LAB_00106d75:
    pthread_join(ctx->dec_thr,(void **)0x0);
    if (ctx->enc_ctx != (MppCtx)0x0) {
      mpp_destroy();
      ctx->enc_ctx = (MppCtx)0x0;
    }
    if (*ppvVar24 != (MppBufferGroup)0x0) {
      mpp_buffer_group_put();
      *ppvVar24 = (MppBufferGroup)0x0;
    }
    if (ctx->dec_pkt_post != (MppPacket)0x0) {
      mpp_packet_deinit(&ctx->dec_pkt_post);
      ctx->dec_pkt_post = (MppPacket)0x0;
    }
    if (ctx->dec_pkt_pre != (MppPacket)0x0) {
      mpp_packet_deinit(&ctx->dec_pkt_pre);
      ctx->dec_pkt_pre = (MppPacket)0x0;
    }
    if (ctx->cfg != (MppEncCfg)0x0) {
      mpp_enc_cfg_deinit();
      ctx->cfg = (MppEncCfg)0x0;
    }
    if (ctx->dec_ctx_post != (MppCtx)0x0) {
      mpp_destroy();
      ctx->dec_ctx_post = (MppCtx)0x0;
    }
    if (ctx->dec_ctx_pre != (MppCtx)0x0) {
      mpp_destroy();
      ctx->dec_ctx_pre = (MppCtx)0x0;
    }
    if (ctx->dec_in_buf_post != (RK_U8 *)0x0) {
      mpp_osal_free("mpi_rc_codec");
    }
    ctx->dec_in_buf_post = (RK_U8 *)0x0;
    if (ctx->dec_in_buf_pre != (RK_U8 *)0x0) {
      mpp_osal_free("mpi_rc_codec");
    }
    ctx->dec_in_buf_pre = (RK_U8 *)0x0;
    MVar10 = MPP_OK;
  }
  pFVar15 = (FILE *)(ctx->file).fp_enc_out;
  if (pFVar15 != (FILE *)0x0) {
    fclose(pFVar15);
    (ctx->file).fp_enc_out = (FILE *)0x0;
  }
  pFVar15 = (FILE *)(ctx->file).fp_stat;
  if (pFVar15 != (FILE *)0x0) {
    fclose(pFVar15);
    (ctx->file).fp_stat = (FILE *)0x0;
  }
  pFVar15 = (FILE *)(ctx->file).fp_input;
  if (pFVar15 != (FILE *)0x0) {
    fclose(pFVar15);
    (ctx->file).fp_input = (FILE *)0x0;
  }
  if (ctx->reader != (FileReader)0x0) {
    reader_deinit(ctx->reader);
    ctx->reader = (FileReader)0x0;
  }
  if (ctx->com_buf != (RK_U8 *)0x0) {
    mpp_osal_free("mpi_rc_deinit");
  }
  ctx->com_buf = (RK_U8 *)0x0;
LAB_00106ecb:
  mpi_enc_test_cmd_put(cmd);
  return MVar10;
}

Assistant:

int main(int argc, char **argv)
{
    MpiEncTestArgs* enc_cmd = mpi_enc_test_cmd_get();
    MpiRc2TestCtx *ctx = NULL;
    MPP_RET ret = MPP_OK;

    ret = mpi_enc_test_cmd_update_by_args(enc_cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(enc_cmd);

    ctx = mpp_calloc(MpiRc2TestCtx, 1);
    if (NULL == ctx) {
        ret = MPP_ERR_MALLOC;
        goto DONE;
    }

    ctx->enc_cmd = enc_cmd;

    ret = mpi_rc_init(ctx);
    if (ret) {
        mpp_err("mpi_rc_init failded ret %d", ret);
        goto DONE;
    }

    ret = mpi_rc_codec(ctx);
    if (ret)
        mpp_err("mpi_rc_codec failded ret %d", ret);

DONE:
    if (ctx) {
        mpi_rc_deinit(ctx);
        ctx = NULL;
    }

    mpi_enc_test_cmd_put(enc_cmd);

    return (int)ret;
}